

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_avx2.c
# Opt level: O0

void av1_calc_indices_dim1_avx2
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *total_dist,int n,int k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  __m256i a;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int64_t iVar13;
  int64_t *in_RCX;
  long lVar14;
  longlong *in_RDX;
  long in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  int in_R9D;
  __m256i dist2;
  __m256i dist1;
  __m128i d2;
  __m256i px;
  __m256i p1;
  __m256i ind1;
  __m256i cmp;
  __m256i dist;
  int j_1;
  __m256i dist_min;
  __m256i d1;
  __m256i ind;
  __m256i in;
  int i;
  int j;
  __m256i cents [8];
  __m256i sum;
  __m256i v_zero;
  undefined8 local_820;
  undefined8 uStackY_818;
  undefined8 uStackY_810;
  undefined8 uStackY_808;
  undefined8 local_800;
  undefined8 uStackY_7f8;
  undefined8 uStackY_7f0;
  undefined8 in_stack_fffffffffffff818;
  undefined1 in_stack_fffffffffffff820 [16];
  longlong in_stack_fffffffffffff830;
  longlong local_7c0;
  longlong lStack_7b8;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  uint local_704;
  undefined1 local_700 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  int local_668;
  int local_664;
  undefined8 local_660 [32];
  undefined1 local_560 [32];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  int local_508;
  int local_504;
  int64_t *local_500;
  longlong *local_4f8;
  long local_4f0;
  undefined1 (*local_4e8) [32];
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  ushort local_46c;
  ushort local_46a;
  undefined1 (*local_468) [32];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  longlong local_220;
  longlong lStack_218;
  longlong *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  ushort local_a0;
  ushort local_9e;
  ushort local_9c;
  ushort local_9a;
  ushort local_98;
  ushort local_96;
  ushort local_94;
  ushort local_92;
  ushort local_90;
  ushort local_8e;
  ushort local_8c;
  ushort local_8a;
  ushort local_88;
  ushort local_86;
  ushort local_84;
  ushort local_82;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  ushort local_48;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  ushort local_40;
  ushort local_3e;
  ushort local_3c;
  ushort local_3a;
  ushort local_38;
  ushort local_36;
  ushort local_34;
  ushort local_32;
  
  local_4a0 = 0;
  uStack_498 = 0;
  uStack_490 = 0;
  uStack_488 = 0;
  local_540 = 0;
  uStack_538 = 0;
  uStack_530 = 0;
  uStack_528 = 0;
  local_4c0 = 0;
  uStack_4b8 = 0;
  uStack_4b0 = 0;
  uStack_4a8 = 0;
  local_560 = ZEXT1632(ZEXT816(0));
  local_508 = in_R9D;
  local_504 = in_R8D;
  local_500 = in_RCX;
  local_4f8 = in_RDX;
  local_4f0 = in_RSI;
  local_4e8 = in_RDI;
  for (local_664 = 0; local_664 < local_508; local_664 = local_664 + 1) {
    local_46a = *(ushort *)(local_4f0 + (long)local_664 * 2);
    local_82 = local_46a;
    local_84 = local_46a;
    local_86 = local_46a;
    local_88 = local_46a;
    local_8a = local_46a;
    local_8c = local_46a;
    local_8e = local_46a;
    local_90 = local_46a;
    local_92 = local_46a;
    local_94 = local_46a;
    local_96 = local_46a;
    local_98 = local_46a;
    local_9a = local_46a;
    local_9c = local_46a;
    local_9e = local_46a;
    local_a0 = local_46a;
    auVar1 = vpinsrw_avx(ZEXT216(local_46a),(uint)local_46a,1);
    auVar1 = vpinsrw_avx(auVar1,(uint)local_46a,2);
    auVar1 = vpinsrw_avx(auVar1,(uint)local_46a,3);
    auVar1 = vpinsrw_avx(auVar1,(uint)local_46a,4);
    auVar1 = vpinsrw_avx(auVar1,(uint)local_46a,5);
    auVar1 = vpinsrw_avx(auVar1,(uint)local_46a,6);
    auVar1 = vpinsrw_avx(auVar1,(uint)local_46a,7);
    auVar2 = vpinsrw_avx(ZEXT216(local_46a),(uint)local_46a,1);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_46a,2);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_46a,3);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_46a,4);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_46a,5);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_46a,6);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_46a,7);
    local_c0._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    local_c0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    auVar3 = local_c0;
    uVar10 = local_c0._8_8_;
    uVar11 = local_c0._16_8_;
    uVar12 = local_c0._24_8_;
    lVar14 = (long)local_664;
    local_660[lVar14 * 4] = local_c0._0_8_;
    local_c0 = auVar3;
    local_660[lVar14 * 4 + 1] = uVar10;
    local_660[lVar14 * 4 + 2] = uVar11;
    local_660[lVar14 * 4 + 3] = uVar12;
  }
  for (local_668 = 0; local_668 < local_504; local_668 = local_668 + 0x10) {
    local_468 = local_4e8;
    local_4e0 = ZEXT832(0) << 0x20;
    auVar9 = local_4e0;
    local_4e0._8_8_ = SUB328(ZEXT832(0),4);
    local_6c0 = ZEXT832((ulong)local_4e0._8_8_) << 0x40;
    local_400 = *(undefined8 *)*local_4e8;
    uStack_3f8 = *(undefined8 *)(*local_4e8 + 8);
    uStack_3f0 = *(undefined8 *)(*local_4e8 + 0x10);
    uStack_3e8 = *(undefined8 *)(*local_4e8 + 0x18);
    local_420 = local_660[0];
    uStack_418 = local_660[1];
    uStack_410 = local_660[2];
    uStack_408 = local_660[3];
    auVar3._8_8_ = local_660[1];
    auVar3._0_8_ = local_660[0];
    auVar3._16_8_ = local_660[2];
    auVar3._24_8_ = local_660[3];
    auVar3 = vpsubw_avx2(*local_4e8,auVar3);
    local_6e0 = auVar3._0_8_;
    uStack_6d8 = auVar3._8_8_;
    uStack_6d0 = auVar3._16_8_;
    uStack_6c8 = auVar3._24_8_;
    local_3c0 = local_6e0;
    uStack_3b8 = uStack_6d8;
    uStack_3b0 = uStack_6d0;
    uStack_3a8 = uStack_6c8;
    local_700 = vpabsw_avx2(auVar3);
    for (local_704 = 1; (int)local_704 < local_508; local_704 = local_704 + 1) {
      lVar14 = (long)(int)local_704;
      local_440 = *(undefined8 *)*local_4e8;
      uStack_438 = *(undefined8 *)(*local_4e8 + 8);
      uStack_430 = *(undefined8 *)(*local_4e8 + 0x10);
      uStack_428 = *(undefined8 *)(*local_4e8 + 0x18);
      local_460 = local_660[lVar14 * 4];
      uStack_458 = local_660[lVar14 * 4 + 1];
      uStack_450 = local_660[lVar14 * 4 + 2];
      uStack_448 = local_660[lVar14 * 4 + 3];
      auVar6._8_8_ = local_660[lVar14 * 4 + 1];
      auVar6._0_8_ = local_660[lVar14 * 4];
      auVar6._16_8_ = local_660[lVar14 * 4 + 2];
      auVar6._24_8_ = local_660[lVar14 * 4 + 3];
      auVar3 = vpsubw_avx2(*local_4e8,auVar6);
      local_6e0 = auVar3._0_8_;
      uStack_6d8 = auVar3._8_8_;
      uStack_6d0 = auVar3._16_8_;
      uStack_6c8 = auVar3._24_8_;
      local_3e0 = local_6e0;
      uStack_3d8 = uStack_6d8;
      uStack_3d0 = uStack_6d0;
      uStack_3c8 = uStack_6c8;
      auVar3 = vpabsw_avx2(auVar3);
      local_740 = auVar3._0_8_;
      uStack_738 = auVar3._8_8_;
      uStack_730 = auVar3._16_8_;
      uStack_728 = auVar3._24_8_;
      local_380 = local_700._0_8_;
      uStack_378 = local_700._8_8_;
      uStack_370 = local_700._16_8_;
      uStack_368 = local_700._24_8_;
      local_3a0 = local_740;
      uStack_398 = uStack_738;
      uStack_390 = uStack_730;
      uStack_388 = uStack_728;
      local_2c0 = vpcmpgtw_avx2(local_700,auVar3);
      local_340 = local_700._0_8_;
      uStack_338 = local_700._8_8_;
      uStack_330 = local_700._16_8_;
      uStack_328 = local_700._24_8_;
      local_360 = local_740;
      uStack_358 = uStack_738;
      uStack_350 = uStack_730;
      uStack_348 = uStack_728;
      local_700 = vpminsw_avx2(local_700,auVar3);
      local_46c = (ushort)local_704;
      local_32 = (ushort)local_704;
      local_34 = (ushort)local_704;
      local_36 = (ushort)local_704;
      local_38 = (ushort)local_704;
      local_3a = (ushort)local_704;
      local_3c = (ushort)local_704;
      local_3e = (ushort)local_704;
      local_40 = (ushort)local_704;
      local_42 = (ushort)local_704;
      local_44 = (ushort)local_704;
      local_46 = (ushort)local_704;
      local_48 = (ushort)local_704;
      local_4a = (ushort)local_704;
      local_4c = (ushort)local_704;
      local_4e = (ushort)local_704;
      local_50 = (ushort)local_704;
      auVar1 = vpinsrw_avx(ZEXT216((ushort)local_704),local_704 & 0xffff,1);
      auVar1 = vpinsrw_avx(auVar1,local_704 & 0xffff,2);
      auVar1 = vpinsrw_avx(auVar1,local_704 & 0xffff,3);
      auVar1 = vpinsrw_avx(auVar1,local_704 & 0xffff,4);
      auVar1 = vpinsrw_avx(auVar1,local_704 & 0xffff,5);
      auVar1 = vpinsrw_avx(auVar1,local_704 & 0xffff,6);
      local_80 = vpinsrw_avx(auVar1,local_704 & 0xffff,7);
      auVar1 = vpinsrw_avx(ZEXT216((ushort)local_704),local_704 & 0xffff,1);
      auVar1 = vpinsrw_avx(auVar1,local_704 & 0xffff,2);
      auVar1 = vpinsrw_avx(auVar1,local_704 & 0xffff,3);
      auVar1 = vpinsrw_avx(auVar1,local_704 & 0xffff,4);
      auVar1 = vpinsrw_avx(auVar1,local_704 & 0xffff,5);
      auVar1 = vpinsrw_avx(auVar1,local_704 & 0xffff,6);
      auStack_70 = vpinsrw_avx(auVar1,local_704 & 0xffff,7);
      auVar2 = auStack_70;
      auVar1 = local_80;
      local_2e0 = local_6c0._0_8_;
      uStack_2d8 = local_6c0._8_8_;
      uStack_2d0 = local_6c0._16_8_;
      uStack_2c8 = local_6c0._24_8_;
      auVar3 = vpcmpeqd_avx2(local_2c0,local_2c0);
      local_300 = vpand_avx2(local_2c0 ^ auVar3,local_6c0);
      local_280 = local_2c0;
      local_2a0 = local_80._0_8_;
      uStack_298 = local_80._8_8_;
      uStack_290 = auStack_70._0_8_;
      uStack_288 = auStack_70._8_8_;
      auVar7._16_8_ = auStack_70._0_8_;
      auVar7._0_16_ = local_80;
      auVar7._24_8_ = auStack_70._8_8_;
      local_320 = vpand_avx2(local_2c0,auVar7);
      local_6c0 = vpor_avx2(local_300,local_320);
      local_80 = auVar1;
      auStack_70 = auVar2;
    }
    local_240 = local_6c0._0_8_;
    uStack_238 = local_6c0._8_8_;
    uStack_230 = local_6c0._16_8_;
    uStack_228 = local_6c0._24_8_;
    local_260 = local_540;
    uStack_258 = uStack_538;
    uStack_250 = uStack_530;
    uStack_248 = uStack_528;
    auVar4._8_8_ = uStack_538;
    auVar4._0_8_ = local_540;
    auVar4._16_8_ = uStack_530;
    auVar4._24_8_ = uStack_528;
    auVar3 = vpackuswb_avx2(local_6c0,auVar4);
    auVar3 = vpermq_avx2(auVar3,0x58);
    local_7c0 = auVar3._0_8_;
    lStack_7b8 = auVar3._8_8_;
    local_208 = local_4f8;
    local_220 = local_7c0;
    lStack_218 = lStack_7b8;
    *local_4f8 = local_7c0;
    local_4f8[1] = lStack_7b8;
    if (local_500 != (int64_t *)0x0) {
      local_1e0 = local_700._0_8_;
      uStack_1d8 = local_700._8_8_;
      uStack_1d0 = local_700._16_8_;
      uStack_1c8 = local_700._24_8_;
      local_200 = local_700._0_8_;
      uStack_1f8 = local_700._8_8_;
      uStack_1f0 = local_700._16_8_;
      uStack_1e8 = local_700._24_8_;
      auVar3 = vpmaddwd_avx2(local_700,local_700);
      local_700._0_8_ = auVar3._0_8_;
      local_700._8_8_ = auVar3._8_8_;
      local_700._16_8_ = auVar3._16_8_;
      local_700._24_8_ = auVar3._24_8_;
      local_1a0 = local_700._0_8_;
      uStack_198 = local_700._8_8_;
      uStack_190 = local_700._16_8_;
      uStack_188 = local_700._24_8_;
      local_1c0 = local_540;
      uStack_1b8 = uStack_538;
      uStack_1b0 = uStack_530;
      uStack_1a8 = uStack_528;
      auVar5._8_8_ = uStack_538;
      auVar5._0_8_ = local_540;
      auVar5._16_8_ = uStack_530;
      auVar5._24_8_ = uStack_528;
      auVar5 = vpunpckldq_avx2(auVar3,auVar5);
      local_800 = auVar5._0_8_;
      uStackY_7f8 = auVar5._8_8_;
      uStackY_7f0 = auVar5._16_8_;
      in_stack_fffffffffffff818 = auVar5._24_8_;
      local_160 = local_700._0_8_;
      uStack_158 = local_700._8_8_;
      uStack_150 = local_700._16_8_;
      uStack_148 = local_700._24_8_;
      local_180 = local_540;
      uStack_178 = uStack_538;
      uStack_170 = uStack_530;
      uStack_168 = uStack_528;
      auVar8._8_8_ = uStack_538;
      auVar8._0_8_ = local_540;
      auVar8._16_8_ = uStack_530;
      auVar8._24_8_ = uStack_528;
      auVar4 = vpunpckhdq_avx2(auVar3,auVar8);
      local_e0 = local_560._0_8_;
      uStack_d8 = local_560._8_8_;
      uStack_d0 = local_560._16_8_;
      uStack_c8 = local_560._24_8_;
      local_100 = local_800;
      uStack_f8 = uStackY_7f8;
      uStack_f0 = uStackY_7f0;
      uStack_e8 = in_stack_fffffffffffff818;
      auVar3 = vpaddq_avx2(local_560,auVar5);
      local_560._0_8_ = auVar3._0_8_;
      local_560._8_8_ = auVar3._8_8_;
      local_560._16_8_ = auVar3._16_8_;
      local_560._24_8_ = auVar3._24_8_;
      local_820 = auVar4._0_8_;
      uStackY_818 = auVar4._8_8_;
      uStackY_810 = auVar4._16_8_;
      uStackY_808 = auVar4._24_8_;
      local_120 = local_560._0_8_;
      uStack_118 = local_560._8_8_;
      uStack_110 = local_560._16_8_;
      uStack_108 = local_560._24_8_;
      local_140 = local_820;
      uStack_138 = uStackY_818;
      uStack_130 = uStackY_810;
      uStack_128 = uStackY_808;
      local_560 = vpaddq_avx2(auVar3,auVar4);
    }
    local_4f8 = local_4f8 + 2;
    local_4e8 = local_4e8 + 1;
    in_stack_fffffffffffff830 = local_7c0;
    local_4e0 = auVar9;
  }
  if (local_500 != (int64_t *)0x0) {
    a._8_16_ = in_stack_fffffffffffff820;
    a[0] = in_stack_fffffffffffff818;
    a[3] = in_stack_fffffffffffff830;
    iVar13 = k_means_horizontal_sum_avx2(a);
    *local_500 = iVar13;
  }
  return;
}

Assistant:

void av1_calc_indices_dim1_avx2(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *total_dist, int n,
                                int k) {
  const __m256i v_zero = _mm256_setzero_si256();
  __m256i sum = _mm256_setzero_si256();
  __m256i cents[PALETTE_MAX_SIZE];
  for (int j = 0; j < k; ++j) {
    cents[j] = _mm256_set1_epi16(centroids[j]);
  }

  for (int i = 0; i < n; i += 16) {
    const __m256i in = _mm256_loadu_si256((__m256i *)data);
    __m256i ind = _mm256_setzero_si256();
    // Compute the distance to the first centroid.
    __m256i d1 = _mm256_sub_epi16(in, cents[0]);
    __m256i dist_min = _mm256_abs_epi16(d1);

    for (int j = 1; j < k; ++j) {
      // Compute the distance to the centroid.
      d1 = _mm256_sub_epi16(in, cents[j]);
      const __m256i dist = _mm256_abs_epi16(d1);
      // Compare to the minimal one.
      const __m256i cmp = _mm256_cmpgt_epi16(dist_min, dist);
      dist_min = _mm256_min_epi16(dist_min, dist);
      const __m256i ind1 = _mm256_set1_epi16(j);
      ind = _mm256_or_si256(_mm256_andnot_si256(cmp, ind),
                            _mm256_and_si256(cmp, ind1));
    }

    const __m256i p1 = _mm256_packus_epi16(ind, v_zero);
    const __m256i px = _mm256_permute4x64_epi64(p1, 0x58);
    const __m128i d2 = _mm256_extracti128_si256(px, 0);

    _mm_storeu_si128((__m128i *)indices, d2);

    if (total_dist) {
      // Square, convert to 32 bit and add together.
      dist_min = _mm256_madd_epi16(dist_min, dist_min);
      // Convert to 64 bit and add to sum.
      const __m256i dist1 = _mm256_unpacklo_epi32(dist_min, v_zero);
      const __m256i dist2 = _mm256_unpackhi_epi32(dist_min, v_zero);
      sum = _mm256_add_epi64(sum, dist1);
      sum = _mm256_add_epi64(sum, dist2);
    }

    indices += 16;
    data += 16;
  }
  if (total_dist) {
    *total_dist = k_means_horizontal_sum_avx2(sum);
  }
}